

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::CutFab>::FabArray
          (FabArray<amrex::CutFab> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::CutFab> *factory)

{
  type pFVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_stack_00000008;
  pointer in_stack_ffffffffffffff48;
  unique_ptr<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
  *in_stack_ffffffffffffff50;
  FabArrayStats *this_00;
  FabArrayBase *in_stack_ffffffffffffff60;
  
  FabArrayBase::FabArrayBase(in_stack_ffffffffffffff60);
  *in_RDI = (long)&PTR__FabArray_01803e78;
  (**(code **)(*in_stack_00000008 + 0x28))();
  std::
  unique_ptr<amrex::FabFactory<amrex::CutFab>,std::default_delete<amrex::FabFactory<amrex::CutFab>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::CutFab>>,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 0x1f));
  *(undefined1 *)(in_RDI + 0x20) = 0;
  this_00 = (FabArrayStats *)(in_RDI + 0x21);
  std::vector<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>::vector
            ((vector<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_> *)0x118088f);
  in_RDI[0x24] = 0;
  MultiArray4<double>::MultiArray4((MultiArray4<double> *)(in_RDI + 0x25));
  MultiArray4<const_double>::MultiArray4((MultiArray4<const_double> *)(in_RDI + 0x26));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11808d2);
  ShMem::ShMem((ShMem *)(in_RDI + 0x2a));
  std::unique_ptr<amrex::FBData<amrex::CutFab>,std::default_delete<amrex::FBData<amrex::CutFab>>>::
  unique_ptr<std::default_delete<amrex::FBData<amrex::CutFab>>,void>
            ((unique_ptr<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
              *)this_00);
  std::unique_ptr<amrex::PCData<amrex::CutFab>,std::default_delete<amrex::PCData<amrex::CutFab>>>::
  unique_ptr<std::default_delete<amrex::PCData<amrex::CutFab>>,void>
            ((unique_ptr<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
              *)this_00);
  std::
  unique_ptr<amrex::FabArray<amrex::CutFab>,std::default_delete<amrex::FabArray<amrex::CutFab>>>::
  unique_ptr<std::default_delete<amrex::FabArray<amrex::CutFab>>,void>
            ((unique_ptr<amrex::FabArray<amrex::CutFab>,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
              *)this_00);
  FabArrayBase::FabArrayStats::recordBuild(this_00);
  pFVar1 = std::
           unique_ptr<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
                        *)this_00);
  (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,in_ECX,in_R8,in_R9,pFVar1);
  return;
}

Assistant:

FabArray<FAB>::FabArray (const BoxArray&            bxs,
                         const DistributionMapping& dm,
                         int                        nvar,
                         const IntVect&             ngrow,
                         const MFInfo&              info,
                         const FabFactory<FAB>&     factory)
    : m_factory(factory.clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(bxs,dm,nvar,ngrow,info,*m_factory);
}